

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldValue(ParserImpl *this)

{
  Tokenizer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *buffer;
  TokenType TVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  char *__end;
  AlphaNum *in_R8;
  bool bVar8;
  string text;
  string local_e0;
  AlphaNum local_b0;
  string local_80;
  AlphaNum local_60;
  
  iVar5 = this->recursion_limit_;
  this->recursion_limit_ = iVar5 + -1;
  if (iVar5 < 1) {
    local_e0._M_dataplus._M_p =
         "Message is too deep, the parser exceeded the configured recursion limit of ";
    local_e0._M_string_length = 0x4b;
    buffer = local_b0.digits;
    local_b0.piece_data_ = buffer;
    pcVar6 = FastInt32ToBufferLeft(this->initial_recursion_limit_,buffer);
    local_b0.piece_size_ = (long)pcVar6 - (long)buffer;
    local_60.piece_data_ = ".";
    local_60.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_80,(protobuf *)&local_e0,&local_b0,&local_60,in_R8);
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
LAB_003be08c:
      operator_delete(local_80._M_dataplus._M_p);
    }
LAB_003be091:
    bVar4 = false;
  }
  else {
    this_00 = &this->tokenizer_;
    if ((this->tokenizer_).current_.type == TYPE_STRING) {
      while ((this_00->current_).type == TYPE_STRING) {
        io::Tokenizer::Next(this_00);
      }
    }
    else {
      paVar1 = &local_e0.field_2;
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"[","");
      bVar4 = TryConsume(this,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if (bVar4) {
        do {
          local_e0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"{","");
          sVar7 = (this->tokenizer_).current_.text._M_string_length;
          if (sVar7 == local_e0._M_string_length) {
            if (sVar7 == 0) {
              bVar4 = true;
            }
            else {
              iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                           local_e0._M_dataplus._M_p,sVar7);
              bVar4 = iVar5 == 0;
            }
          }
          else {
            bVar4 = false;
          }
          if (bVar4) {
LAB_003bded9:
            bVar8 = false;
          }
          else {
            local_b0.piece_data_ = local_b0.digits;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"<","");
            sVar7 = (this->tokenizer_).current_.text._M_string_length;
            bVar8 = true;
            if (sVar7 == local_b0.piece_size_) {
              if (sVar7 == 0) goto LAB_003bded9;
              iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_b0.piece_data_,
                           sVar7);
              bVar8 = iVar5 != 0;
            }
          }
          if ((!bVar4) && (local_b0.piece_data_ != local_b0.digits)) {
            operator_delete(local_b0.piece_data_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          if (bVar8) {
            bVar4 = SkipFieldValue(this);
          }
          else {
            bVar4 = SkipFieldMessage(this);
          }
          if (bVar4 == false) break;
          local_e0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"]","");
          bVar4 = TryConsume(this,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          if (bVar4) goto LAB_003bdffc;
          local_e0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,",","");
          bVar4 = Consume(this,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
        } while (bVar4);
        goto LAB_003be091;
      }
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"-","");
      bVar4 = TryConsume(this,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      TVar2 = (this_00->current_).type;
      if (2 < TVar2 - TYPE_IDENTIFIER) {
        pcVar3 = (this->tokenizer_).current_.text._M_dataplus._M_p;
        local_e0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar3,
                   pcVar3 + (this->tokenizer_).current_.text._M_string_length);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b0,"Cannot skip field value, unexpected token: ",&local_e0);
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)&local_b0);
LAB_003be202:
        if (local_b0.piece_data_ != local_b0.digits) {
          operator_delete(local_b0.piece_data_);
        }
        this->recursion_limit_ = this->recursion_limit_ + 1;
        local_80._M_dataplus._M_p = local_e0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar1) goto LAB_003be08c;
        goto LAB_003be091;
      }
      if (bVar4 && TVar2 == TYPE_IDENTIFIER) {
        pcVar3 = (this->tokenizer_).current_.text._M_dataplus._M_p;
        local_e0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar3,
                   pcVar3 + (this->tokenizer_).current_.text._M_string_length);
        if (local_e0._M_string_length != 0) {
          sVar7 = 0;
          do {
            if ((byte)(local_e0._M_dataplus._M_p[sVar7] + 0xbfU) < 0x1a) {
              local_e0._M_dataplus._M_p[sVar7] = local_e0._M_dataplus._M_p[sVar7] | 0x20;
            }
            sVar7 = sVar7 + 1;
          } while (local_e0._M_string_length != sVar7);
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_e0);
        if (((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_e0), iVar5 != 0))
           && (iVar5 = std::__cxx11::string::compare((char *)&local_e0), iVar5 != 0)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_b0,"Invalid float number: ",&local_e0);
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)&local_b0);
          goto LAB_003be202;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
      }
      io::Tokenizer::Next(this_00);
    }
LAB_003bdffc:
    this->recursion_limit_ = this->recursion_limit_ + 1;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool SkipFieldValue() {
    if (--recursion_limit_ < 0) {
      ReportError(
          StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
        tokenizer_.Next();
      }
      ++recursion_limit_;
      return true;
    }
    if (TryConsume("[")) {
      while (true) {
        if (!LookingAt("{") && !LookingAt("<")) {
          DO(SkipFieldValue());
        } else {
          DO(SkipFieldMessage());
        }
        if (TryConsume("]")) {
          break;
        }
        DO(Consume(","));
      }
      ++recursion_limit_;
      return true;
    }
    // Possible field values other than string:
    //   12345        => TYPE_INTEGER
    //   -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //   1.2345       => TYPE_FLOAT
    //   -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //   inf          => TYPE_IDENTIFIER
    //   -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    //   TYPE_INTEGER => TYPE_IDENTIFIER
    // Divides them into two group, one with TYPE_SYMBOL
    // and the other without:
    //   Group one:
    //     12345        => TYPE_INTEGER
    //     1.2345       => TYPE_FLOAT
    //     inf          => TYPE_IDENTIFIER
    //     TYPE_INTEGER => TYPE_IDENTIFIER
    //   Group two:
    //     -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //     -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //     -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    // As we can see, the field value consists of an optional '-' and one of
    // TYPE_INTEGER, TYPE_FLOAT and TYPE_IDENTIFIER.
    bool has_minus = TryConsume("-");
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER) &&
        !LookingAtType(io::Tokenizer::TYPE_FLOAT) &&
        !LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      ReportError("Cannot skip field value, unexpected token: " + text);
      ++recursion_limit_;
      return false;
    }
    // Combination of '-' and TYPE_IDENTIFIER may result in an invalid field
    // value while other combinations all generate valid values.
    // We check if the value of this combination is valid here.
    // TYPE_IDENTIFIER after a '-' should be one of the float values listed
    // below:
    //   inf, inff, infinity, nan
    if (has_minus && LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      LowerString(&text);
      if (text != "inf" &&
          text != "infinity" && text != "nan") {
        ReportError("Invalid float number: " + text);
        ++recursion_limit_;
        return false;
      }
    }
    tokenizer_.Next();
    ++recursion_limit_;
    return true;
  }